

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uchar *puVar6;
  long lVar7;
  ImFont *pIVar8;
  int iVar9;
  ImFontAtlasCustomRect *pIVar10;
  float *pfVar11;
  int iVar12;
  ulong uVar13;
  uchar *__s;
  uint uVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  ImVec2 uv1;
  ImVec2 uv0;
  ulong __n;
  
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                  ,0x9a8,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar10 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar2 = pIVar10->X;
  if (uVar2 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                  ,0x95a,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar10->Width != 0xd9) || (pIVar10->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                    ,0x960,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    ImFontAtlasBuildRender1bppRectFromString
              (atlas,(uint)uVar2,(uint)pIVar10->Y,0x6c,0x1b,
               "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
               ,'.',0xff);
    ImFontAtlasBuildRender1bppRectFromString
              (atlas,uVar2 + 0x6d,(uint)pIVar10->Y,0x6c,0x1b,
               "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
               ,'X',0xff);
  }
  else {
    if ((pIVar10->Width != 2) || (pIVar10->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                    ,0x969,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar12 = (uint)pIVar10->Y * atlas->TexWidth + (uint)uVar2;
    lVar15 = (long)(atlas->TexWidth + iVar12);
    atlas->TexPixelsAlpha8[lVar15 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar15] = 0xff;
    atlas->TexPixelsAlpha8[(long)iVar12 + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar12] = 0xff;
  }
  uVar2 = pIVar10->Y;
  fVar1 = (atlas->TexUvScale).y;
  (atlas->TexUvWhitePixel).x = ((float)pIVar10->X + 0.5) * (atlas->TexUvScale).x;
  (atlas->TexUvWhitePixel).y = ((float)uVar2 + 0.5) * fVar1;
  if ((atlas->Flags & 4) == 0) {
    pIVar10 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    if (pIVar10->X == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                    ,0x977,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    pfVar11 = &atlas->TexUvLines[0].w;
    iVar12 = 0;
    uVar13 = 0;
    do {
      if (pIVar10->Height <= uVar13) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                      ,0x981,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar2 = pIVar10->Width;
      uVar14 = iVar12 + (uint)uVar2 >> 1;
      __n = (ulong)uVar14;
      puVar6 = atlas->TexPixelsAlpha8;
      uVar3 = pIVar10->X;
      uVar4 = pIVar10->Y;
      iVar9 = (int)uVar13;
      iVar5 = atlas->TexWidth;
      __s = puVar6 + ((iVar9 + (uint)uVar4) * iVar5 + (uint)uVar3);
      memset(__s,0,__n);
      memset(__s + __n,0xff,uVar13);
      memset(puVar6 + (ulong)(((uint)uVar4 + iVar9) * iVar5 + (uint)uVar3) + uVar13 + __n,0,
             (ulong)((uVar2 - uVar14) + iVar12));
      uVar2 = pIVar10->X;
      fVar1 = (atlas->TexUvScale).x;
      fVar17 = (atlas->TexUvScale).y;
      uVar13 = uVar13 + 1;
      fVar17 = ((float)(int)((uint)pIVar10->Y + iVar9 + 1) * fVar17 +
               (float)(int)(iVar9 + (uint)pIVar10->Y) * fVar17) * 0.5;
      ((ImVec4 *)(pfVar11 + -3))->x = (float)((uVar14 + uVar2) - 1) * fVar1;
      pfVar11[-2] = fVar17;
      pfVar11[-1] = (float)(iVar9 + 1 + uVar14 + uVar2) * fVar1;
      *pfVar11 = fVar17;
      pfVar11 = pfVar11 + 4;
      iVar12 = iVar12 + -1;
    } while (uVar13 != 0x40);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar15 = 0;
    lVar16 = 0;
    do {
      pIVar10 = (atlas->CustomRects).Data;
      lVar7 = *(long *)((long)&pIVar10->Font + lVar15);
      if ((lVar7 != 0) && (*(int *)((long)&pIVar10->GlyphID + lVar15) != 0)) {
        if (*(ImFontAtlas **)(lVar7 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                        ,0x9b4,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        uv0.x = 0.0;
        uv0.y = 0.0;
        uv1.x = 0.0;
        uv1.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar10->Width + lVar15),&uv0,&uv1);
        fVar1 = *(float *)((long)&(pIVar10->GlyphOffset).x + lVar15);
        fVar17 = *(float *)((long)&(pIVar10->GlyphOffset).y + lVar15);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar10->Font + lVar15),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar10->GlyphID + lVar15),fVar1,fVar17,
                         (float)*(ushort *)((long)&pIVar10->Width + lVar15) + fVar1,
                         (float)*(ushort *)((long)&pIVar10->Height + lVar15) + fVar17,uv0.x,uv0.y,
                         uv1.x,uv1.y,*(float *)((long)&pIVar10->GlyphAdvanceX + lVar15));
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar16 < (atlas->CustomRects).Size);
  }
  uVar14 = (atlas->Fonts).Size;
  if (0 < (int)uVar14) {
    lVar15 = 0;
    do {
      pIVar8 = (atlas->Fonts).Data[lVar15];
      if (pIVar8->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar8);
      }
      lVar15 = lVar15 + 1;
      uVar14 = (atlas->Fonts).Size;
    } while (lVar15 < (int)uVar14);
  }
  if (0 < (int)uVar14) {
    uVar13 = 0;
    do {
      if ((long)(atlas->Fonts).Size <= (long)uVar13) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                      ,0x644,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
      }
      pIVar8 = (atlas->Fonts).Data[uVar13];
      if (pIVar8->EllipsisChar == 0xffff) {
        lVar15 = 0;
        do {
          uVar2 = *(ushort *)((long)&DAT_001e707c + lVar15);
          if ((((ulong)uVar2 < (ulong)(long)(pIVar8->IndexLookup).Size) &&
              ((pIVar8->IndexLookup).Data[uVar2] != 0xffff)) &&
             ((pIVar8->Glyphs).Data != (ImFontGlyph *)0x0)) {
            pIVar8->EllipsisChar = uVar2;
            break;
          }
          lVar15 = lVar15 + 2;
        } while (lVar15 == 2);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar14);
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}